

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256Cbc_Test::~CryptoUtil_EncryptAes256Cbc_Test
          (CryptoUtil_EncryptAes256Cbc_Test *this)

{
  CryptoUtil_EncryptAes256Cbc_Test *this_local;
  
  ~CryptoUtil_EncryptAes256Cbc_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256Cbc) {
  ByteData key(
      "3334353637383930313233343536373833343536373839303132333435363738");
  ByteData iv("33343536373839303132333435363738");
  ByteData byte_data = CryptoUtil::EncryptAes256Cbc(
      key.GetBytes(), iv.GetBytes(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "aaf07c2bce50048b41e931898ad647a38d91324abd47121aa4d625fbc2aeb3a8d57df4f18f25599a4c40a9a7c547479c");
}